

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O0

U64 __thiscall USBPacket::AddRawByteFrames(USBPacket *this,USBAnalyzerResults *pResults)

{
  U64 UVar1;
  size_type sVar2;
  byte *pbVar3;
  reference puVar4;
  reference pvVar5;
  __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
  local_d8;
  __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
  local_d0;
  __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
  local_c8;
  __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
  local_c0 [3];
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  string local_68 [8];
  string bytes_row;
  unsigned_long_long local_48;
  Frame f;
  ulong local_20;
  size_t bc;
  USBAnalyzerResults *pResults_local;
  USBPacket *this_local;
  
  Frame::Frame((Frame *)&local_48);
  std::__cxx11::string::string(local_68);
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mData);
    if (sVar2 <= local_20) break;
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->mData,local_20);
    int2str_sal_abi_cxx11_((U64)local_a8,(uint)*pbVar3,2);
    std::operator+(local_88,(char *)local_a8);
    std::__cxx11::string::operator+=(local_68,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string(local_a8);
    local_c8._M_current =
         (unsigned_long_long *)
         std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::begin
                   (&this->mBitBeginSamples);
    local_c0[0] = __gnu_cxx::
                  __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
                  ::operator+(&local_c8,local_20 << 3);
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
             ::operator*(local_c0);
    local_48 = *puVar4;
    local_d8._M_current =
         (unsigned_long_long *)
         std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::begin
                   (&this->mBitBeginSamples);
    local_d0 = __gnu_cxx::
               __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
               ::operator+(&local_d8,local_20 * 8 + 8);
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
             ::operator*(&local_d0);
    _f = *puVar4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->mData,local_20);
    AnalyzerResults::AddFrame((Frame *)pResults);
    local_20 = local_20 + 1;
  }
  pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::back
                     (&this->mBitBeginSamples);
  local_48 = *pvVar5;
  _f = this->mSampleEnd;
  AnalyzerResults::AddFrame((Frame *)pResults);
  AnalyzerResults::CommitResults();
  UVar1 = _f;
  std::__cxx11::string::~string(local_68);
  Frame::~Frame((Frame *)&local_48);
  return UVar1;
}

Assistant:

U64 USBPacket::AddRawByteFrames( USBAnalyzerResults* pResults )
{
    // raw data
    size_t bc;
    Frame f;
    f.mType = FT_Byte;
    f.mData2 = 0;
    f.mFlags = FF_None;
    std::string bytes_row;
    for( bc = 0; bc < mData.size(); ++bc )
    {
        bytes_row += int2str_sal( mData[ bc ], Hexadecimal, 8 ) + ", ";

        f.mStartingSampleInclusive = *( mBitBeginSamples.begin() + bc * 8 );
        f.mEndingSampleInclusive = *( mBitBeginSamples.begin() + ( bc + 1 ) * 8 );
        f.mData1 = mData[ bc ];
        pResults->AddFrame( f );
    }

    // add the EOP frame
    f.mStartingSampleInclusive = mBitBeginSamples.back();
    // EOP is 2 bits SE0 and one bit J, so add another bit
    f.mEndingSampleInclusive = mSampleEnd;
    f.mData1 = f.mData2 = 0;
    f.mFlags = FF_None;
    f.mType = FT_EOP;
    pResults->AddFrame( f );

    pResults->CommitResults();

    return f.mEndingSampleInclusive;
}